

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_store(Forth *this)

{
  double local_20;
  double x;
  Forth *pFStack_10;
  AAddr aaddr;
  Forth *this_local;
  
  pFStack_10 = this;
  requireDStackDepth(this,1,"F!");
  requireFStackDepth(this,1,"F!");
  x._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_20 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell(this,x._4_4_,&local_20);
  return;
}

Assistant:

void f_store() {
			REQUIRE_DSTACK_DEPTH(1, "F!");
			REQUIRE_FSTACK_DEPTH(1, "F!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "F!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell(aaddr, x);
		}